

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O1

bool __thiscall
AsyncRgbLedAnalyzer::DetectSpeedMode
          (AsyncRgbLedAnalyzer *this,double positiveTimeSec,double negativeTimeSec,BitState *value)

{
  BitState BVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  BitState local_68 [2];
  BitTiming local_60;
  
  this->mDidDetectHighSpeed = false;
  local_68[0] = BIT_LOW;
  local_68[1] = BIT_HIGH;
  AsyncRgbLedAnalyzerSettings::DataTiming
            (&local_60,
             (this->mSettings)._M_t.
             super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_LOW,false
            );
  bVar3 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
  if (bVar3) {
LAB_00107608:
    *value = BIT_LOW;
    this->mFirstBitAfterReset = false;
    bVar3 = true;
  }
  else {
    lVar2 = 4;
    do {
      lVar5 = lVar2;
      if (lVar5 == 8) goto LAB_0010766f;
      BVar1 = *(BitState *)((long)local_68 + lVar5);
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BVar1,
                 false);
      bVar3 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
      lVar2 = lVar5 + 4;
    } while (!bVar3);
    *value = BVar1;
    this->mFirstBitAfterReset = false;
    if (lVar5 != 8) {
      return true;
    }
LAB_0010766f:
    bVar3 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported
                      ((this->mSettings)._M_t.
                       super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                       .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
    if (bVar3) {
      local_68[0] = BIT_LOW;
      local_68[1] = BIT_HIGH;
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_LOW,
                 true);
      bVar3 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
      if (bVar3) {
        this->mDidDetectHighSpeed = true;
        goto LAB_00107608;
      }
      lVar2 = 4;
      do {
        lVar5 = lVar2;
        if (lVar5 == 8) goto LAB_00107716;
        BVar1 = *(BitState *)((long)local_68 + lVar5);
        AsyncRgbLedAnalyzerSettings::DataTiming
                  (&local_60,
                   (this->mSettings)._M_t.
                   super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                   .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BVar1,
                   true);
        bVar3 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
        lVar2 = lVar5 + 4;
      } while (!bVar3);
      this->mDidDetectHighSpeed = true;
      *value = BVar1;
      this->mFirstBitAfterReset = false;
      if (lVar5 != 8) {
        return true;
      }
    }
LAB_00107716:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed to classify: ",0x14);
    poVar4 = std::ostream::_M_insert<double>(positiveTimeSec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"/",1);
    poVar4 = std::ostream::_M_insert<double>(negativeTimeSec);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AsyncRgbLedAnalyzer::DetectSpeedMode( double positiveTimeSec, double negativeTimeSec, BitState& value )
{
    mDidDetectHighSpeed = false;

    // low speed bits
    for( const auto b : { BIT_LOW, BIT_HIGH } )
    {
        if( mSettings->DataTiming( b ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
        {
            value = b;
            mFirstBitAfterReset = false;
            return true;
        }
    }

    if( mSettings->IsHighSpeedSupported() )
    {
        // high speed bits
        for( const auto b : { BIT_LOW, BIT_HIGH } )
        {
            if( mSettings->DataTiming( b, true ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
            {
                mDidDetectHighSpeed = true;
                value = b;
                mFirstBitAfterReset = false;
                return true;
            }
        }
    } // of high-speed mode tests

    std::cerr << "failed to classify: " << positiveTimeSec << "/" << negativeTimeSec << std::endl;
    return false;
}